

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::EscapeForCMake_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view str,
          WrapQuotes wrapQuotes)

{
  char cVar1;
  char *pcVar2;
  const_iterator pvVar3;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string_view *__range1;
  allocator<char> local_26;
  undefined1 local_25;
  int local_24;
  undefined1 auStack_20 [4];
  WrapQuotes wrapQuotes_local;
  string_view str_local;
  string *result;
  
  str_local._M_len = str._M_len;
  local_24 = (int)str._M_str;
  local_25 = 0;
  pcVar2 = "PK\x01\x02";
  if (local_24 == 0) {
    pcVar2 = "\n\t\t\t\"";
  }
  _auStack_20 = this;
  str_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar2 + 4,&local_26);
  std::allocator<char>::~allocator(&local_26);
  __end1 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  for (; __end1 != pvVar3; __end1 = __end1 + 1) {
    cVar1 = *__end1;
    if (cVar1 == '\"') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
    }
    else if (cVar1 == '$') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\$");
    }
    else if (cVar1 == '\\') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    }
  }
  if (local_24 == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForCMake(cm::string_view str,
                                              WrapQuotes wrapQuotes)
{
  // Always double-quote the argument to take care of most escapes.
  std::string result = (wrapQuotes == WrapQuotes::Wrap) ? "\"" : "";
  for (const char c : str) {
    if (c == '"') {
      // Escape the double quote to avoid ending the argument.
      result += "\\\"";
    } else if (c == '$') {
      // Escape the dollar to avoid expanding variables.
      result += "\\$";
    } else if (c == '\\') {
      // Escape the backslash to avoid other escapes.
      result += "\\\\";
    } else {
      // Other characters will be parsed correctly.
      result += c;
    }
  }
  if (wrapQuotes == WrapQuotes::Wrap) {
    result += "\"";
  }
  return result;
}